

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::DisabledOptimizersSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  pointer str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> list
  ;
  string param;
  set<duckdb::OptimizerType,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
  disabled_optimizers;
  OptimizerType local_9c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_98;
  string local_80;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  Value::ToString_abi_cxx11_((string *)local_60,input);
  ::std::__cxx11::string::string((string *)&local_80,",",(allocator *)&local_9c);
  StringUtil::Split(&local_98,(string *)local_60,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)local_60);
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  local_60._16_8_ = 0;
  local_38 = 0;
  local_40 = (_Base_ptr)local_60._24_8_;
  for (str = local_98.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      str != local_98.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; str = str + 1) {
    StringUtil::Lower(&local_80,str);
    StringUtil::Trim(&local_80);
    if (local_80._M_string_length != 0) {
      local_9c = OptimizerTypeFromString(&local_80);
      ::std::
      _Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
      ::_M_insert_unique<duckdb::OptimizerType>
                ((_Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
                  *)local_60,&local_9c);
    }
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  ::std::
  _Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
  ::operator=(&(config->options).disabled_optimizers._M_t,
              (_Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
               *)local_60);
  ::std::
  _Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
  ::~_Rb_tree((_Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
               *)local_60);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_98);
  return;
}

Assistant:

void DisabledOptimizersSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto list = StringUtil::Split(input.ToString(), ",");
	set<OptimizerType> disabled_optimizers;
	for (auto &entry : list) {
		auto param = StringUtil::Lower(entry);
		StringUtil::Trim(param);
		if (param.empty()) {
			continue;
		}
		disabled_optimizers.insert(OptimizerTypeFromString(param));
	}
	config.options.disabled_optimizers = std::move(disabled_optimizers);
}